

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O2

void __thiscall muduo::ThreadPool::stop(ThreadPool *this)

{
  pointer puVar1;
  unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_> *thr;
  pointer puVar2;
  MutexLockGuard lock;
  MutexLockGuard local_18;
  
  local_18.mutex_ = &this->mutex_;
  MutexLock::lock(local_18.mutex_);
  this->running_ = false;
  pthread_cond_broadcast((pthread_cond_t *)&(this->notEmpty_).pcond_);
  MutexLockGuard::~MutexLockGuard(&local_18);
  puVar1 = (this->threads_).
           super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->threads_).
                super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    Thread::join((puVar2->_M_t).
                 super___uniq_ptr_impl<muduo::Thread,_std::default_delete<muduo::Thread>_>._M_t.
                 super__Tuple_impl<0UL,_muduo::Thread_*,_std::default_delete<muduo::Thread>_>.
                 super__Head_base<0UL,_muduo::Thread_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void ThreadPool::stop()
{
  {
  MutexLockGuard lock(mutex_);
  running_ = false;
  notEmpty_.notifyAll();
  }
  for (auto& thr : threads_)
  {
    thr->join();
  }
}